

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::
statement<char_const(&)[25],char_const*&,unsigned_char&,char_const(&)[2],char_const*&,char_const(&)[10],std::__cxx11::string&,char_const(&)[3],char_const*&,char_const(&)[10],std::__cxx11::string&,char_const(&)[2]>
          (CompilerGLSL *this,char (*ts) [25],char **ts_1,uchar *ts_2,char (*ts_3) [2],char **ts_4,
          char (*ts_5) [10],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_6,
          char (*ts_7) [3],char **ts_8,char (*ts_9) [10],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_10,char (*ts_11) [2]
          )

{
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  bool bVar1;
  uint local_7c;
  spirv_cross local_78 [4];
  uint32_t i;
  char **local_58;
  char **ts_local_4;
  char (*ts_local_3) [2];
  uchar *ts_local_2;
  char **ts_local_1;
  char (*ts_local) [25];
  CompilerGLSL *this_local;
  
  local_58 = ts_4;
  ts_local_4 = (char **)ts_3;
  ts_local_3 = (char (*) [2])ts_2;
  ts_local_2 = (uchar *)ts_1;
  ts_local_1 = (char **)ts;
  ts_local = (char (*) [25])this;
  bVar1 = Compiler::is_forcing_recompilation(&this->super_Compiler);
  if (bVar1) {
    this->statement_count = this->statement_count + 1;
  }
  else if (this->redirect_statement ==
           (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            *)0x0) {
    for (local_7c = 0; local_7c < this->indent; local_7c = local_7c + 1) {
      StringStream<4096UL,_4096UL>::operator<<(&this->buffer,"    ");
    }
    statement_inner<char_const(&)[25],char_const*&,unsigned_char&,char_const(&)[2],char_const*&,char_const(&)[10],std::__cxx11::string&,char_const(&)[3],char_const*&,char_const(&)[10],std::__cxx11::string&,char_const(&)[2]>
              (this,(char (*) [25])ts_local_1,(char **)ts_local_2,(uchar *)ts_local_3,
               (char (*) [2])ts_local_4,local_58,ts_5,ts_6,ts_7,ts_8,ts_9,ts_10,ts_11);
    StringStream<4096UL,_4096UL>::operator<<(&this->buffer,'\n');
  }
  else {
    this_00 = this->redirect_statement;
    join<char_const(&)[25],char_const*&,unsigned_char&,char_const(&)[2],char_const*&,char_const(&)[10],std::__cxx11::string&,char_const(&)[3],char_const*&,char_const(&)[10],std::__cxx11::string&,char_const(&)[2]>
              (local_78,(char (*) [25])ts_local_1,(char **)ts_local_2,(uchar *)ts_local_3,
               (char (*) [2])ts_local_4,local_58,ts_5,ts_6,ts_7,ts_8,ts_9,ts_10,ts_11);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_78);
    ::std::__cxx11::string::~string((string *)local_78);
    this->statement_count = this->statement_count + 1;
  }
  return;
}

Assistant:

inline void statement(Ts &&... ts)
	{
		if (is_forcing_recompilation())
		{
			// Do not bother emitting code while force_recompile is active.
			// We will compile again.
			statement_count++;
			return;
		}

		if (redirect_statement)
		{
			redirect_statement->push_back(join(std::forward<Ts>(ts)...));
			statement_count++;
		}
		else
		{
			for (uint32_t i = 0; i < indent; i++)
				buffer << "    ";
			statement_inner(std::forward<Ts>(ts)...);
			buffer << '\n';
		}
	}